

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O1

_Bool av1_add_to_hash_map_by_row_with_precal_data
                (hash_table *p_hash_table,uint32_t **pic_hash,int8_t *pic_is_same,int pic_width,
                int pic_height,int block_size)

{
  int iVar1;
  int iVar2;
  Vector *pVVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  hash_table *phVar7;
  _Bool _Var8;
  block_hash curr_block_hash;
  uint local_84;
  undefined2 local_80;
  undefined2 local_7e;
  uint32_t local_7c;
  ulong local_78;
  hash_table *local_70;
  int local_68;
  int local_64;
  uint32_t *local_60;
  uint32_t *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  uVar6 = pic_width - block_size;
  local_58 = *pic_hash;
  local_60 = pic_hash[1];
  local_70 = p_hash_table;
  iVar1 = hash_block_size_to_index(block_size);
  local_84 = uVar6 >> 0x1f;
  _Var8 = SUB41(uVar6 >> 0x1f,0);
  if (-1 < (int)uVar6) {
    local_38 = (long)pic_width;
    local_40 = (ulong)((pic_height - block_size) + 1);
    local_50 = (ulong)uVar6;
    local_48 = (ulong)(uVar6 + 1);
    local_78 = 0;
    phVar7 = local_70;
    local_68 = pic_height;
    local_64 = block_size;
    do {
      if (local_64 <= local_68) {
        lVar4 = 0;
        uVar5 = 0;
        do {
          if (pic_is_same[lVar4] != '\0') {
            local_80 = (undefined2)local_78;
            local_7e = (undefined2)uVar5;
            uVar6 = (uint)(ushort)local_58[lVar4] | iVar1 << 0x10;
            local_7c = local_60[lVar4];
            pVVar3 = phVar7->p_lookup_table[uVar6];
            if (pVVar3 == (Vector *)0x0) {
              pVVar3 = (Vector *)aom_malloc(0x20);
              phVar7->p_lookup_table[uVar6] = pVVar3;
              if (phVar7->p_lookup_table[uVar6] == (Vector *)0x0) {
                return local_84._0_1_;
              }
              iVar2 = aom_vector_setup(phVar7->p_lookup_table[uVar6],10,8);
              if (iVar2 == -1) {
                return local_84._0_1_;
              }
              pVVar3 = local_70->p_lookup_table[uVar6];
            }
            iVar2 = aom_vector_push_back(pVVar3,&local_80);
            phVar7 = local_70;
            if (iVar2 == -1) {
              return local_84._0_1_;
            }
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + local_38;
        } while (local_40 != uVar5);
      }
      _Var8 = local_50 <= local_78;
      local_78 = local_78 + 1;
      local_84 = (uint)_Var8;
      pic_is_same = pic_is_same + 1;
      local_58 = local_58 + 1;
      local_60 = local_60 + 1;
    } while (local_78 != local_48);
  }
  local_84._0_1_ = _Var8;
  return local_84._0_1_;
}

Assistant:

bool av1_add_to_hash_map_by_row_with_precal_data(hash_table *p_hash_table,
                                                 uint32_t *pic_hash[2],
                                                 int8_t *pic_is_same,
                                                 int pic_width, int pic_height,
                                                 int block_size) {
  const int x_end = pic_width - block_size + 1;
  const int y_end = pic_height - block_size + 1;

  const int8_t *src_is_added = pic_is_same;
  const uint32_t *src_hash[2] = { pic_hash[0], pic_hash[1] };

  int add_value = hash_block_size_to_index(block_size);
  assert(add_value >= 0);
  add_value <<= kSrcBits;
  const int crc_mask = (1 << kSrcBits) - 1;

  for (int x_pos = 0; x_pos < x_end; x_pos++) {
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      const int pos = y_pos * pic_width + x_pos;
      // valid data
      if (src_is_added[pos]) {
        block_hash curr_block_hash;
        curr_block_hash.x = x_pos;
        curr_block_hash.y = y_pos;

        const uint32_t hash_value1 = (src_hash[0][pos] & crc_mask) + add_value;
        curr_block_hash.hash_value2 = src_hash[1][pos];

        if (!hash_table_add_to_table(p_hash_table, hash_value1,
                                     &curr_block_hash)) {
          return false;
        }
      }
    }
  }
  return true;
}